

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseGateStandard(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_GateType_t GateType)

{
  Ver_Stream_t *p_00;
  Hop_Man_t *pHVar1;
  char cVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pHVar6;
  char Symbol;
  char *pWord;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNet;
  Ver_Stream_t *p;
  Ver_GateType_t GateType_local;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  p_00 = pMan->pReader;
  iVar3 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if (iVar3 != 0) {
    Ver_StreamMove(p_00);
    cVar2 = Ver_StreamPopChar(p_00);
    if (cVar2 == '(') {
      Ver_ParseSkipComments(pMan);
      pAVar4 = Abc_NtkCreateNode(pNtk);
      while (pcVar5 = Ver_ParseGetName(pMan), pcVar5 != (char *)0x0) {
        pFanin = Ver_ParseFindNet(pNtk,pcVar5);
        if (pFanin == (Abc_Obj_t *)0x0) {
          sprintf(pMan->sError,"Net is missing in gate %s.",pcVar5);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        iVar3 = Abc_ObjFanoutNum(pAVar4);
        if (iVar3 == 0) {
          Abc_ObjAddFanin(pFanin,pAVar4);
        }
        else {
          Abc_ObjAddFanin(pAVar4,pFanin);
        }
        Ver_ParseSkipComments(pMan);
        cVar2 = Ver_StreamPopChar(p_00);
        if (cVar2 == ')') {
          if (((GateType == VER_GATE_BUF) || (GateType == VER_GATE_NOT)) &&
             (iVar3 = Abc_ObjFaninNum(pAVar4), iVar3 != 1)) {
            pAVar4 = Abc_ObjFanout0(pAVar4);
            pcVar5 = Abc_ObjName(pAVar4);
            sprintf(pMan->sError,
                    "Buffer or interver with multiple fanouts %s (currently not supported).",pcVar5)
            ;
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          Ver_ParseSkipComments(pMan);
          cVar2 = Ver_StreamPopChar(p_00);
          if (cVar2 == ';') {
            if ((GateType == VER_GATE_AND) || (GateType == VER_GATE_NAND)) {
              pHVar1 = (Hop_Man_t *)pNtk->pManFunc;
              iVar3 = Abc_ObjFaninNum(pAVar4);
              pHVar6 = Hop_CreateAnd(pHVar1,iVar3);
              (pAVar4->field_5).pData = pHVar6;
            }
            else if ((GateType == VER_GATE_OR) || (GateType == VER_GATE_NOR)) {
              pHVar1 = (Hop_Man_t *)pNtk->pManFunc;
              iVar3 = Abc_ObjFaninNum(pAVar4);
              pHVar6 = Hop_CreateOr(pHVar1,iVar3);
              (pAVar4->field_5).pData = pHVar6;
            }
            else if ((GateType == VER_GATE_XOR) || (GateType == VER_GATE_XNOR)) {
              pHVar1 = (Hop_Man_t *)pNtk->pManFunc;
              iVar3 = Abc_ObjFaninNum(pAVar4);
              pHVar6 = Hop_CreateExor(pHVar1,iVar3);
              (pAVar4->field_5).pData = pHVar6;
            }
            else if ((GateType == VER_GATE_BUF) || (GateType == VER_GATE_NOT)) {
              pHVar1 = (Hop_Man_t *)pNtk->pManFunc;
              iVar3 = Abc_ObjFaninNum(pAVar4);
              pHVar6 = Hop_CreateAnd(pHVar1,iVar3);
              (pAVar4->field_5).pData = pHVar6;
            }
            if ((((GateType == VER_GATE_NAND) || (GateType == VER_GATE_NOR)) ||
                (GateType == VER_GATE_XNOR)) || (GateType == VER_GATE_NOT)) {
              pHVar6 = Hop_Not((Hop_Obj_t *)(pAVar4->field_5).pData);
              (pAVar4->field_5).pData = pHVar6;
            }
            return 1;
          }
          pAVar4 = Abc_ObjFanout0(pAVar4);
          pcVar5 = Abc_ObjName(pAVar4);
          sprintf(pMan->sError,"Cannot read standard gate %s (expected closing semicolumn).",pcVar5)
          ;
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        if (cVar2 != ',') {
          pAVar4 = Abc_ObjFanout0(pAVar4);
          pcVar5 = Abc_ObjName(pAVar4);
          sprintf(pMan->sError,"Cannot parse a standard gate %s (expected closing parenthesis).",
                  pcVar5);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        Ver_ParseSkipComments(pMan);
      }
    }
    else {
      sprintf(pMan->sError,"Cannot parse a standard gate (expected opening parenthesis).");
      Ver_ParsePrintErrorMessage(pMan);
    }
  }
  return 0;
}

Assistant:

int Ver_ParseGateStandard( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_GateType_t GateType )
{
    extern void Ver_StreamMove( Ver_Stream_t * p );
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNet, * pNode;
    char * pWord, Symbol;

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;
    Ver_StreamMove( p );

    // this is gate name - throw it away
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse a standard gate (expected opening parenthesis)." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // create the node
    pNode = Abc_NtkCreateNode( pNtk );

    // parse pairs of formal/actural inputs
    while ( 1 )
    {
        // parse the output name
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;
        // get the net corresponding to this output
        pNet = Ver_ParseFindNet( pNtk, pWord );
        if ( pNet == NULL )
        {
            sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // if this is the first net, add it as an output
        if ( Abc_ObjFanoutNum(pNode) == 0 )
            Abc_ObjAddFanin( pNet, pNode );
        else
            Abc_ObjAddFanin( pNode, pNet );
        // check if it is the end of gate
        Ver_ParseSkipComments( pMan );
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ')' )
            break;
        // skip comma
        if ( Symbol != ',' )
        {
            sprintf( pMan->sError, "Cannot parse a standard gate %s (expected closing parenthesis).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        Ver_ParseSkipComments( pMan );
    }
    if ( (GateType == VER_GATE_BUF || GateType == VER_GATE_NOT) && Abc_ObjFaninNum(pNode) != 1 )
    {
        sprintf( pMan->sError, "Buffer or interver with multiple fanouts %s (currently not supported).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot read standard gate %s (expected closing semicolumn).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    // add logic function
    if ( GateType == VER_GATE_AND || GateType == VER_GATE_NAND )
        pNode->pData = Hop_CreateAnd( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_OR || GateType == VER_GATE_NOR )
        pNode->pData = Hop_CreateOr( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_XOR || GateType == VER_GATE_XNOR )
        pNode->pData = Hop_CreateExor( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_BUF || GateType == VER_GATE_NOT )
        pNode->pData = Hop_CreateAnd( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    if ( GateType == VER_GATE_NAND || GateType == VER_GATE_NOR || GateType == VER_GATE_XNOR || GateType == VER_GATE_NOT )
        pNode->pData = Hop_Not( (Hop_Obj_t *)pNode->pData );
    return 1;
}